

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_common.cpp
# Opt level: O3

int __thiscall pstore::brokerface::writer::writer(writer *this,UI *ui,UI_STRING *uis)

{
  value_type vVar1;
  undefined8 uVar2;
  _Manager_type p_Var3;
  uint in_ECX;
  undefined8 *in_R8;
  
  this->_vptr_writer = (_func_int **)&PTR__writer_0015d510;
  vVar1 = *(value_type *)ui;
  *(undefined4 *)ui = 0xffffffff;
  (this->fd_).fd_ = vVar1;
  (this->retry_timeout_).__r = (rep)uis;
  this->max_retries_ = in_ECX;
  *(undefined8 *)&(this->update_cb_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->update_cb_).super__Function_base._M_functor + 8) = 0;
  (this->update_cb_).super__Function_base._M_manager = (_Manager_type)0x0;
  p_Var3 = (_Manager_type)in_R8[3];
  (this->update_cb_)._M_invoker = (_Invoker_type)p_Var3;
  if (in_R8[2] != 0) {
    uVar2 = in_R8[1];
    *(undefined8 *)&(this->update_cb_).super__Function_base._M_functor = *in_R8;
    *(undefined8 *)((long)&(this->update_cb_).super__Function_base._M_functor + 8) = uVar2;
    p_Var3 = (_Manager_type)in_R8[2];
    (this->update_cb_).super__Function_base._M_manager = p_Var3;
    in_R8[2] = 0;
    in_R8[3] = 0;
  }
  return (int)p_Var3;
}

Assistant:

writer::writer (fifo_path::client_pipe && pipe, duration_type const retry_timeout,
                        unsigned const max_retries, update_callback cb)
                : fd_{std::move (pipe)}
                , retry_timeout_{retry_timeout}
                , max_retries_{max_retries}
                , update_cb_{std::move (cb)} {}